

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::ErrorCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,ErrorCode code)

{
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  undefined4 local_14;
  string *psStack_10;
  ErrorCode code_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OK",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"CANCELLED",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"INVALID_ARGS",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"INVALID_COMMAND",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"TIMEOUT",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NOT_FOUND",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SECURITY",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNIMPLEMENTED",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"BAD_FORMAT",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"BUSY",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OUT_OF_MEMORY",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"IO_ERROR",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"IO_BUSY",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ALREADY_EXISTS",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ABORTED",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"INVALID_STATE",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"REJECTED",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"COAP_ERROR",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"REGISTRY_ERROR",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  default:
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ErrorCodeToString(ErrorCode code)
{
    switch (code)
    {
    case ErrorCode::kNone:
        return "OK";
    case ErrorCode::kCancelled:
        return "CANCELLED";
    case ErrorCode::kInvalidArgs:
        return "INVALID_ARGS";
    case ErrorCode::kInvalidCommand:
        return "INVALID_COMMAND";
    case ErrorCode::kTimeout:
        return "TIMEOUT";
    case ErrorCode::kNotFound:
        return "NOT_FOUND";
    case ErrorCode::kSecurity:
        return "SECURITY";
    case ErrorCode::kUnimplemented:
        return "UNIMPLEMENTED";
    case ErrorCode::kBadFormat:
        return "BAD_FORMAT";
    case ErrorCode::kBusy:
        return "BUSY";
    case ErrorCode::kOutOfMemory:
        return "OUT_OF_MEMORY";
    case ErrorCode::kIOError:
        return "IO_ERROR";
    case ErrorCode::kIOBusy:
        return "IO_BUSY";
    case ErrorCode::kAlreadyExists:
        return "ALREADY_EXISTS";
    case ErrorCode::kAborted:
        return "ABORTED";
    case ErrorCode::kInvalidState:
        return "INVALID_STATE";
    case ErrorCode::kRejected:
        return "REJECTED";
    case ErrorCode::kCoapError:
        return "COAP_ERROR";
    case ErrorCode::kRegistryError:
        return "REGISTRY_ERROR";
    case ErrorCode::kUnknown:
        return "UNKNOWN";

    default:
        VerifyOrDie(false);
        return "UNKNOWN";
    }
}